

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringbuilder.h
# Opt level: O0

void __thiscall
QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[4]>,_QString_&>,_const_char_(&)[2]>,_ProString>
::~QStringBuilder(QStringBuilder<QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[4]>,_QString_&>,_const_char_(&)[2]>,_ProString>
                  *this)

{
  ProString::~ProString((ProString *)0x21bd90);
  QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[4]>,_QString_&>,_const_char_(&)[2]>
  ::~QStringBuilder((QStringBuilder<QStringBuilder<QStringBuilder<QString,_const_char_(&)[4]>,_QString_&>,_const_char_(&)[2]>
                     *)0x21bd9a);
  return;
}

Assistant:

~QStringBuilder() = default;